

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

size_t __thiscall
spvtools::opt::analysis::Type::ComputeHashValue(Type *this,size_t hash,SeenTypes *seen)

{
  Type ***pppTVar1;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *pvVar2;
  pointer *pppTVar3;
  int iVar4;
  Type **ppTVar5;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *d;
  Type ***pppTVar7;
  Type **ppTVar8;
  pointer pvVar9;
  pointer ppTVar10;
  uint *puVar11;
  ulong uVar12;
  Type *local_30;
  undefined4 extraout_var;
  
  pppTVar1 = (Type ***)
             (seen->large_data_)._M_t.
             super___uniq_ptr_impl<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             .
             super__Head_base<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_false>
             ._M_head_impl;
  pppTVar7 = &seen->small_data_;
  if (pppTVar1 != (Type ***)0x0) {
    pppTVar7 = pppTVar1;
  }
  if (pppTVar1 == (Type ***)0x0) {
    ppTVar10 = seen->small_data_ + seen->size_;
  }
  else {
    ppTVar10 = *(pointer *)
                &((_Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)(pppTVar1 + 1))->_M_impl;
  }
  local_30 = this;
  ppTVar5 = std::
            __find_if<spvtools::opt::analysis::Type_const**,__gnu_cxx::__ops::_Iter_equals_val<spvtools::opt::analysis::Type_const*const>>
                      (*pppTVar7,ppTVar10);
  pvVar2 = (seen->large_data_)._M_t.
           super___uniq_ptr_impl<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
           .
           super__Head_base<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_false>
           ._M_head_impl;
  if (pvVar2 == (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 *)0x0) {
    ppTVar8 = seen->small_data_ + seen->size_;
  }
  else {
    ppTVar8 = (pvVar2->
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (ppTVar5 == ppTVar8) {
    local_30 = this;
    utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::push_back(seen,&local_30);
    uVar12 = (hash >> 2) + hash * 0x40 + 0x9e3779b9 + (ulong)this->kind_ ^ hash;
    for (pvVar9 = (this->decorations_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar9 != (this->decorations_).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar9 = pvVar9 + 1) {
      for (puVar11 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar11 !=
          (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
        uVar12 = uVar12 ^ uVar12 * 0x40 + 0x9e3779b9 + (uVar12 >> 2) + (ulong)*puVar11;
      }
    }
    switch(this->kind_) {
    case kVoid:
      iVar4 = (*this->_vptr_Type[6])(this);
      plVar6 = (long *)CONCAT44(extraout_var,iVar4);
      break;
    case kBool:
      iVar4 = (*this->_vptr_Type[8])(this);
      plVar6 = (long *)CONCAT44(extraout_var_13,iVar4);
      break;
    case kInteger:
      iVar4 = (*this->_vptr_Type[10])(this);
      plVar6 = (long *)CONCAT44(extraout_var_09,iVar4);
      break;
    case kFloat:
      iVar4 = (*this->_vptr_Type[0xc])(this);
      plVar6 = (long *)CONCAT44(extraout_var_11,iVar4);
      break;
    case kVector:
      iVar4 = (*this->_vptr_Type[0xe])(this);
      plVar6 = (long *)CONCAT44(extraout_var_04,iVar4);
      break;
    case kMatrix:
      iVar4 = (*this->_vptr_Type[0x10])(this);
      plVar6 = (long *)CONCAT44(extraout_var_17,iVar4);
      break;
    case kImage:
      iVar4 = (*this->_vptr_Type[0x12])(this);
      plVar6 = (long *)CONCAT44(extraout_var_20,iVar4);
      break;
    case kSampler:
      iVar4 = (*this->_vptr_Type[0x14])(this);
      plVar6 = (long *)CONCAT44(extraout_var_12,iVar4);
      break;
    case kSampledImage:
      iVar4 = (*this->_vptr_Type[0x16])(this);
      plVar6 = (long *)CONCAT44(extraout_var_23,iVar4);
      break;
    case kArray:
      iVar4 = (*this->_vptr_Type[0x18])(this);
      plVar6 = (long *)CONCAT44(extraout_var_06,iVar4);
      break;
    case kRuntimeArray:
      iVar4 = (*this->_vptr_Type[0x1a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_22,iVar4);
      break;
    case kNodePayloadArrayAMDX:
      iVar4 = (*this->_vptr_Type[0x1c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_03,iVar4);
      break;
    case kStruct:
      iVar4 = (*this->_vptr_Type[0x1e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_05,iVar4);
      break;
    case kOpaque:
      iVar4 = (*this->_vptr_Type[0x20])(this);
      plVar6 = (long *)CONCAT44(extraout_var_19,iVar4);
      break;
    case kPointer:
      iVar4 = (*this->_vptr_Type[0x22])(this);
      plVar6 = (long *)CONCAT44(extraout_var_02,iVar4);
      break;
    case kFunction:
      iVar4 = (*this->_vptr_Type[0x24])(this);
      plVar6 = (long *)CONCAT44(extraout_var_10,iVar4);
      break;
    case kEvent:
      iVar4 = (*this->_vptr_Type[0x26])(this);
      plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
      break;
    case kDeviceEvent:
      iVar4 = (*this->_vptr_Type[0x28])(this);
      plVar6 = (long *)CONCAT44(extraout_var_15,iVar4);
      break;
    case kReserveId:
      iVar4 = (*this->_vptr_Type[0x2a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_21,iVar4);
      break;
    case kQueue:
      iVar4 = (*this->_vptr_Type[0x2c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_26,iVar4);
      break;
    case kPipe:
      iVar4 = (*this->_vptr_Type[0x2e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_16,iVar4);
      break;
    case kForwardPointer:
      iVar4 = (*this->_vptr_Type[0x30])(this);
      plVar6 = (long *)CONCAT44(extraout_var_18,iVar4);
      break;
    case kPipeStorage:
      iVar4 = (*this->_vptr_Type[0x32])(this);
      plVar6 = (long *)CONCAT44(extraout_var_25,iVar4);
      break;
    case kNamedBarrier:
      iVar4 = (*this->_vptr_Type[0x34])(this);
      plVar6 = (long *)CONCAT44(extraout_var_27,iVar4);
      break;
    case kAccelerationStructureNV:
      iVar4 = (*this->_vptr_Type[0x36])(this);
      plVar6 = (long *)CONCAT44(extraout_var_08,iVar4);
      break;
    case kCooperativeMatrixNV:
      iVar4 = (*this->_vptr_Type[0x38])(this);
      plVar6 = (long *)CONCAT44(extraout_var_07,iVar4);
      break;
    case kCooperativeMatrixKHR:
      iVar4 = (*this->_vptr_Type[0x3a])(this);
      plVar6 = (long *)CONCAT44(extraout_var_30,iVar4);
      break;
    case kCooperativeVectorNV:
      iVar4 = (*this->_vptr_Type[0x3c])(this);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
      break;
    case kRayQueryKHR:
      iVar4 = (*this->_vptr_Type[0x3e])(this);
      plVar6 = (long *)CONCAT44(extraout_var_28,iVar4);
      break;
    case kHitObjectNV:
      iVar4 = (*this->_vptr_Type[0x40])(this);
      plVar6 = (long *)CONCAT44(extraout_var_29,iVar4);
      break;
    case kTensorLayoutNV:
      iVar4 = (*this->_vptr_Type[0x42])(this);
      plVar6 = (long *)CONCAT44(extraout_var_24,iVar4);
      break;
    case kTensorViewNV:
      iVar4 = (*this->_vptr_Type[0x44])(this);
      plVar6 = (long *)CONCAT44(extraout_var_14,iVar4);
      break;
    default:
      __assert_fail("false && \"Unhandled type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                    ,0xfc,
                    "size_t spvtools::opt::analysis::Type::ComputeHashValue(size_t, SeenTypes *) const"
                   );
    }
    hash = (**(code **)(*plVar6 + 0x228))(plVar6,uVar12,seen);
    pvVar2 = (seen->large_data_)._M_t.
             super___uniq_ptr_impl<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_std::default_delete<std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>_>
             .
             super__Head_base<0UL,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_*,_false>
             ._M_head_impl;
    if (pvVar2 == (vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                   *)0x0) {
      seen->size_ = seen->size_ - 1;
    }
    else {
      pppTVar3 = &(pvVar2->
                  super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + -1;
    }
  }
  return hash;
}

Assistant:

size_t Type::ComputeHashValue(size_t hash, SeenTypes* seen) const {
  // Linear search through a dense, cache coherent vector is faster than O(log
  // n) search in a complex data structure (eg std::set) for the generally small
  // number of nodes.  It also skips the overhead of an new/delete per Type
  // (when inserting/removing from a set).
  if (std::find(seen->begin(), seen->end(), this) != seen->end()) {
    return hash;
  }

  seen->push_back(this);

  hash = hash_combine(hash, uint32_t(kind_));
  for (const auto& d : decorations_) {
    hash = hash_combine(hash, d);
  }

  switch (kind_) {
#define DeclareKindCase(type)                             \
  case k##type:                                           \
    hash = As##type()->ComputeExtraStateHash(hash, seen); \
    break
    DeclareKindCase(Void);
    DeclareKindCase(Bool);
    DeclareKindCase(Integer);
    DeclareKindCase(Float);
    DeclareKindCase(Vector);
    DeclareKindCase(Matrix);
    DeclareKindCase(Image);
    DeclareKindCase(Sampler);
    DeclareKindCase(SampledImage);
    DeclareKindCase(Array);
    DeclareKindCase(RuntimeArray);
    DeclareKindCase(NodePayloadArrayAMDX);
    DeclareKindCase(Struct);
    DeclareKindCase(Opaque);
    DeclareKindCase(Pointer);
    DeclareKindCase(Function);
    DeclareKindCase(Event);
    DeclareKindCase(DeviceEvent);
    DeclareKindCase(ReserveId);
    DeclareKindCase(Queue);
    DeclareKindCase(Pipe);
    DeclareKindCase(ForwardPointer);
    DeclareKindCase(PipeStorage);
    DeclareKindCase(NamedBarrier);
    DeclareKindCase(AccelerationStructureNV);
    DeclareKindCase(CooperativeMatrixNV);
    DeclareKindCase(CooperativeMatrixKHR);
    DeclareKindCase(CooperativeVectorNV);
    DeclareKindCase(RayQueryKHR);
    DeclareKindCase(HitObjectNV);
    DeclareKindCase(TensorLayoutNV);
    DeclareKindCase(TensorViewNV);
#undef DeclareKindCase
    default:
      assert(false && "Unhandled type");
      break;
  }

  seen->pop_back();
  return hash;
}